

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::ListAggregatesBindData_const*>
          (Serializer *this,field_id_t field_id,char *tag,ListAggregatesBindData **value,
          ListAggregatesBindData **default_value)

{
  undefined1 uVar1;
  
  if ((this[9] == (Serializer)0x0) && (*value == *default_value)) {
    uVar1 = 0;
    (**(code **)(*(long *)this + 0x20))(this,field_id,tag,0);
  }
  else {
    (**(code **)(*(long *)this + 0x20))(this,field_id,tag,1);
    WriteValue<duckdb::ListAggregatesBindData>(this,*value);
    uVar1 = 1;
  }
  (**(code **)(*(long *)this + 0x28))(this,uVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}